

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O1

void __thiscall RTree_node::~RTree_node(RTree_node *this)

{
  Polygon *pPVar1;
  pointer pdVar2;
  RTree_node *this_00;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  
  if (this->is_leaf == false) {
    if (0 < this->elements) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        this_00 = *(RTree_node **)
                   ((long)&((this->data_internal_node).
                            super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>.
                            _M_impl.super__Vector_impl_data._M_start)->child + lVar5);
        if (this_00 != (RTree_node *)0x0) {
          ~RTree_node(this_00);
          operator_delete(this_00,0x48);
        }
        pdVar3 = (this->data_internal_node).
                 super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar3->child + lVar5) = 0;
        pPVar1 = *(Polygon **)((long)&pdVar3->region + lVar5);
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
          operator_delete(pPVar1,0x38);
        }
        *(undefined8 *)
         ((long)&((this->data_internal_node).
                  super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                  super__Vector_impl_data._M_start)->region + lVar5) = 0;
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar4 < this->elements);
    }
  }
  else if (0 < this->elements) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      pPVar1 = *(Polygon **)
                ((long)&((this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>.
                         _M_impl.super__Vector_impl_data._M_start)->polygon + lVar5);
      if (pPVar1 != (Polygon *)0x0) {
        Polygon::~Polygon(pPVar1);
        operator_delete(pPVar1,0x38);
        pdVar2 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar2->polygon + lVar5) = 0;
        pPVar1 = *(Polygon **)((long)&pdVar2->region + lVar5);
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
          operator_delete(pPVar1,0x38);
        }
        *(undefined8 *)
         ((long)&((this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                  super__Vector_impl_data._M_start)->region + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < this->elements);
  }
  pdVar3 = (this->data_internal_node).
           super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->data_internal_node).
                                 super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  pdVar2 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(pdVar2,(long)(this->data_leafs).
                               super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  return;
}

Assistant:

RTree_node::~RTree_node(){
    if(!this->is_leaf){
        for(int i = 0; i < this->elements; i++){
            delete this->data_internal_node[i].child;
            this->data_internal_node[i].child = nullptr;
            delete this->data_internal_node[i].region;
            this->data_internal_node[i].region = nullptr;
        }
    }
    else{
        for(int i = 0; i < this->elements; i++){
            if(this->data_leafs[i].polygon!=nullptr){
                delete this->data_leafs[i].polygon;
                this->data_leafs[i].polygon = nullptr;
                delete this->data_leafs[i].region;
                this->data_leafs[i].region = nullptr;
            }
        }
    }
}